

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Gia_ManFindChainStart(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  piVar2 = p->vLevels->pArray;
  uVar4 = 0xffffffffffffffff;
  iVar5 = 0;
  for (uVar6 = 0; (long)uVar6 < (long)p->nObjs; uVar6 = uVar6 + 1) {
    pGVar3 = Gia_ManObj(p,(int)uVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((*(ulong *)pGVar3 & 0xc0000000c0000000) == 0 && (~(uint)*(ulong *)pGVar3 & 0x1fffffff) != 0)
    {
      iVar1 = piVar2[uVar6];
      if (iVar5 <= iVar1) {
        uVar4 = uVar6;
      }
      uVar4 = uVar4 & 0xffffffff;
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
    }
  }
  return (int)uVar4;
}

Assistant:

int Gia_ManFindChainStart( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int * pDelays = Vec_IntArray(p->vLevels);
    int i, iMax = -1, DelayMax = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsUsed(pObj) )
            continue;
        if ( DelayMax > pDelays[i] )
            continue;
        DelayMax = pDelays[i];
        iMax = i;
    }
    return iMax;
}